

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool __thiscall
libtorrent::anon_unknown_1::extract_single_file2
          (anon_unknown_1 *this,bdecode_node *dict,file_storage *files,string *path,string_view name
          ,ptrdiff_t info_offset,char *info_buffer,error_code *ec)

{
  string_view filename;
  int64_t mtime_00;
  long file_size_00;
  file_flags_t file_flags_00;
  bool bVar1;
  type_t tVar2;
  int iVar3;
  string *psVar4;
  ulong uVar5;
  difference_type dVar6;
  ptrdiff_t pVar7;
  string_view sVar8;
  long local_238;
  digest32<256L> local_208;
  string_view local_1e8;
  undefined1 local_1d8 [8];
  bdecode_node root;
  bdecode_node local_180;
  string *psStack_140;
  string_view pe;
  int local_128;
  int end;
  int i;
  size_t preallocate;
  string_view local_108;
  undefined1 local_f8 [8];
  bdecode_node s_p;
  string local_b0 [8];
  string symlink_path;
  char *pieces_root;
  int64_t local_78;
  time_t mtime;
  uchar local_5b;
  uchar local_5a;
  bitfield_flag local_59;
  long local_58;
  int64_t file_size;
  char *pcStack_48;
  file_flags_t file_flags;
  ptrdiff_t info_offset_local;
  string *path_local;
  file_storage *files_local;
  bdecode_node *dict_local;
  string_view name_local;
  
  pcStack_48 = name._M_str;
  tVar2 = bdecode_node::type((bdecode_node *)this);
  if (tVar2 != dict_t) {
    name_local._M_str._7_1_ = 0;
    goto LAB_0073f342;
  }
  file_size._5_1_ = get_file_attributes((bdecode_node *)this);
  file_size._4_1_ = '\x01';
  file_size._7_1_ = file_size._5_1_;
  file_size._6_1_ =
       libtorrent::flags::operator&
                 (file_size._5_1_,
                  (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\x01');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                    ((bitfield_flag *)((long)&file_size + 6));
  if (bVar1) {
    boost::system::error_code::operator=((error_code *)info_buffer,torrent_invalid_pad_file);
    name_local._M_str._7_1_ = 0;
    goto LAB_0073f342;
  }
  local_5a = file_size._7_1_;
  local_5b = '\b';
  local_59 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                        file_size._7_1_,
                        (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_59);
  if (bVar1) {
    local_238 = 0;
  }
  else {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&mtime,"length");
    local_238 = bdecode_node::dict_find_int_value((bdecode_node *)this,_mtime,-1);
  }
  local_58 = local_238;
  if (((local_238 < 0) || (0x3ffffffe < local_238 / 0x4000)) || (0xfffffffc000 < local_238)) {
    boost::system::error_code::operator=((error_code *)info_buffer,torrent_invalid_length);
    name_local._M_str._7_1_ = 0;
    goto LAB_0073f342;
  }
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&pieces_root,"mtime");
  local_78 = bdecode_node::dict_find_int_value((bdecode_node *)this,_pieces_root,0);
  symlink_path.field_2._8_8_ = 0;
  ::std::__cxx11::string::string(local_b0);
  s_p._62_1_ = file_size._7_1_;
  s_p._61_1_ = '\b';
  s_p._63_1_ = libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                          file_size._7_1_,
                          (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)'\b');
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&s_p.field_0x3f);
  if (bVar1) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_108,"symlink path");
    bdecode_node::dict_find_list((bdecode_node *)local_f8,(bdecode_node *)this,local_108);
    bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_f8);
    if (bVar1) {
      path_length((bdecode_node *)local_f8,(error_code *)info_buffer);
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)info_buffer);
      if (!bVar1) {
        ::std::__cxx11::string::reserve((ulong)local_b0);
        local_128 = 0;
        pe._M_str._4_4_ = bdecode_node::list_size((bdecode_node *)local_f8);
        for (; local_128 < pe._M_str._4_4_; local_128 = local_128 + 1) {
          bdecode_node::list_at(&local_180,(bdecode_node *)local_f8,local_128);
          sVar8 = bdecode_node::string_value(&local_180);
          pe._M_len = (size_t)sVar8._M_str;
          psVar4 = (string *)sVar8._M_len;
          psStack_140 = psVar4;
          bdecode_node::~bdecode_node(&local_180);
          root._56_8_ = psStack_140;
          sVar8._M_str = (char *)psVar4;
          sVar8._M_len = pe._M_len;
          libtorrent::aux::sanitize_append_path_element((aux *)local_b0,psStack_140,sVar8);
        }
        goto LAB_0073f068;
      }
      name_local._M_str._7_1_ = 0;
      bVar1 = true;
    }
    else {
LAB_0073f068:
      bVar1 = false;
    }
    bdecode_node::~bdecode_node((bdecode_node *)local_f8);
    if (!bVar1) goto LAB_0073f0a1;
  }
  else {
LAB_0073f0a1:
    uVar5 = ::std::__cxx11::string::empty();
    if (((uVar5 & 1) != 0) && (0 < local_58)) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1e8,"pieces root");
      bdecode_node::dict_find_string((bdecode_node *)local_1d8,(bdecode_node *)this,local_1e8);
      bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1d8);
      if ((bVar1) && (tVar2 = bdecode_node::type((bdecode_node *)local_1d8), tVar2 == string_t)) {
        iVar3 = bdecode_node::string_length((bdecode_node *)local_1d8);
        dVar6 = digest32<256L>::size();
        if (iVar3 != dVar6) goto LAB_0073f15c;
        pVar7 = bdecode_node::string_offset((bdecode_node *)local_1d8);
        symlink_path.field_2._8_8_ = info_offset + (pVar7 - (long)pcStack_48);
        digest32<256L>::digest32(&local_208,(char *)symlink_path.field_2._8_8_);
        bVar1 = digest32<256L>::is_all_zeros(&local_208);
        if (bVar1) {
          boost::system::error_code::operator=
                    ((error_code *)info_buffer,torrent_missing_pieces_root);
          name_local._M_str._7_1_ = 0;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
LAB_0073f15c:
        boost::system::error_code::operator=((error_code *)info_buffer,torrent_missing_pieces_root);
        name_local._M_str._7_1_ = 0;
        bVar1 = true;
      }
      bdecode_node::~bdecode_node((bdecode_node *)local_1d8);
      if (bVar1) goto LAB_0073f326;
    }
    file_flags_00.m_val = file_size._7_1_;
    file_size_00 = local_58;
    mtime_00 = local_78;
    sVar8 = (string_view)::std::__cxx11::string::operator_cast_to_basic_string_view(local_b0);
    filename._M_str = (char *)name._M_len;
    filename._M_len = (size_t)path;
    file_storage::add_file_borrow
              ((file_storage *)dict,(error_code *)info_buffer,filename,(string *)files,file_size_00,
               file_flags_00,mtime_00,sVar8,(char *)symlink_path.field_2._8_8_);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)info_buffer);
    name_local._M_str._7_1_ = (bVar1 ^ 0xffU) & 1;
  }
LAB_0073f326:
  ::std::__cxx11::string::~string(local_b0);
LAB_0073f342:
  return (bool)(name_local._M_str._7_1_ & 1);
}

Assistant:

bool extract_single_file2(bdecode_node const& dict, file_storage& files
		, std::string const& path, string_view const name
		, std::ptrdiff_t const info_offset, char const* info_buffer
		, error_code& ec)
	{
		if (dict.type() != bdecode_node::dict_t) return false;

		file_flags_t file_flags = get_file_attributes(dict);

		if (file_flags & file_storage::flag_pad_file)
		{
			ec = errors::torrent_invalid_pad_file;
			return false;
		}

		// symlinks have an implied "size" of zero. i.e. they use up 0 bytes of
		// the torrent payload space
		std::int64_t const file_size = (file_flags & file_storage::flag_symlink)
			? 0 : dict.dict_find_int_value("length", -1);

		// if a file is too big, it will cause integer overflow in our
		// calculations of the size of the merkle tree (which is all 'int'
		// indices)
		if (file_size < 0
			|| (file_size / default_block_size) >= file_storage::max_num_pieces
			|| file_size > file_storage::max_file_size)
		{
			ec = errors::torrent_invalid_length;
			return false;
		}

		auto const mtime = static_cast<std::time_t>(dict.dict_find_int_value("mtime", 0));

		char const* pieces_root = nullptr;

		std::string symlink_path;
		if (file_flags & file_storage::flag_symlink)
		{
			if (bdecode_node const s_p = dict.dict_find_list("symlink path"))
			{
				auto const preallocate = static_cast<std::size_t>(path_length(s_p, ec));
				if (ec) return false;
				symlink_path.reserve(preallocate);
				for (int i = 0, end(s_p.list_size()); i < end; ++i)
				{
					auto pe = s_p.list_at(i).string_value();
					aux::sanitize_append_path_element(symlink_path, pe);
				}
			}
		}

		if (symlink_path.empty() && file_size > 0)
		{
			bdecode_node const root = dict.dict_find_string("pieces root");
			if (!root || root.type() != bdecode_node::string_t
				|| root.string_length() != sha256_hash::size())
			{
				ec = errors::torrent_missing_pieces_root;
				return false;
			}
			pieces_root = info_buffer + (root.string_offset() - info_offset);
			if (sha256_hash(pieces_root).is_all_zeros())
			{
				ec = errors::torrent_missing_pieces_root;
				return false;
			}
		}

		files.add_file_borrow(ec, name, path, file_size, file_flags
			, mtime, symlink_path, pieces_root);
		return !ec;
	}